

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O0

void __thiscall EVPExtraTest_DigestSignInit_Test::TestBody(EVPExtraTest_DigestSignInit_Test *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  EVP_MD_CTX *pEVar4;
  EVP_MD *pEVar5;
  EVP_PKEY *pEVar6;
  env_md_ctx_st *peVar7;
  uchar *puVar8;
  char *in_R9;
  string local_2d0;
  AssertHelper local_2b0;
  Message local_2a8;
  int local_29c;
  undefined1 local_298 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_268;
  Message local_260;
  int local_254;
  undefined1 local_250 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_220;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_1d8;
  Message local_1d0;
  int local_1c4;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar__4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> sig;
  Message local_190;
  unsigned_long local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  AssertHelper local_150;
  Message local_148;
  int local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  size_t sig_len;
  AssertHelper local_100;
  Message local_f8;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar__1;
  ScopedEVP_MD_CTX md_ctx;
  string local_68;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  UniquePtr<EVP_PKEY> pkey;
  EVPExtraTest_DigestSignInit_Test *this_local;
  
  LoadExampleRSAKey();
  testing::AssertionResult::AssertionResult<std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_28,
             (unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_28,(AssertionResult *)0x88f863,"false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x17b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  if (bVar1) {
    bssl::internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)&gtest_ar__1.message_);
    pEVar4 = (EVP_MD_CTX *)
             bssl::internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)&gtest_ar__1.message_);
    pEVar5 = EVP_sha256();
    pEVar6 = (EVP_PKEY *)
             std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
    local_a4 = EVP_DigestSignInit(pEVar4,(EVP_PKEY_CTX **)0x0,pEVar5,(ENGINE *)0x0,pEVar6);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a0,&local_a4,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_a0,
                 (AssertionResult *)
                 "EVP_DigestSignInit(md_ctx.get(), __null, EVP_sha256(), __null, pkey.get())",
                 "false","true",in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x17e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
    if (bVar1) {
      peVar7 = bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)&gtest_ar__1.message_);
      local_ec = EVP_DigestSignUpdate(peVar7,"\x01\x02\x03\x04",4);
      testing::AssertionResult::AssertionResult<int>
                ((AssertionResult *)local_e8,&local_ec,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
      if (!bVar1) {
        testing::Message::Message(&local_f8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&sig_len,(internal *)local_e8,
                   (AssertionResult *)"EVP_DigestSignUpdate(md_ctx.get(), kMsg, sizeof(kMsg))",
                   "false","true",in_R9);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_100,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x17f,pcVar3);
        testing::internal::AssertHelper::operator=(&local_100,&local_f8);
        testing::internal::AssertHelper::~AssertHelper(&local_100);
        std::__cxx11::string::~string((string *)&sig_len);
        testing::Message::~Message(&local_f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
      if (bVar1) {
        gtest_ar__3.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        pEVar4 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)&gtest_ar__1.message_);
        local_13c = EVP_DigestSignFinal(pEVar4,(uchar *)0x0,(size_t *)&gtest_ar__3.message_);
        testing::AssertionResult::AssertionResult<int>
                  ((AssertionResult *)local_138,&local_13c,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_138,
                     (AssertionResult *)"EVP_DigestSignFinal(md_ctx.get(), __null, &sig_len)",
                     "false","true",in_R9);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                     ,0x183,pcVar3);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_148);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (bVar1) {
          pEVar6 = (EVP_PKEY *)
                   std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                              &gtest_ar_.message_);
          iVar2 = EVP_PKEY_size(pEVar6);
          local_188 = (unsigned_long)iVar2;
          testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                    ((EqHelper *)local_180,"static_cast<size_t>(EVP_PKEY_size(pkey.get()))",
                     "sig_len",&local_188,(unsigned_long *)&gtest_ar__3.message_);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                       ,0x186,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,&local_190);
            testing::internal::AssertHelper::~AssertHelper
                      ((AssertHelper *)
                       &sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            testing::Message::~Message(&local_190);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__4.message_)
          ;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__4.message_,
                     (size_type)
                     gtest_ar__3.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
          pEVar4 = (EVP_MD_CTX *)
                   bssl::internal::
                   StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                   ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                          *)&gtest_ar__1.message_);
          puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              &gtest_ar__4.message_);
          local_1c4 = EVP_DigestSignFinal(pEVar4,puVar8,(size_t *)&gtest_ar__3.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_1c0,&local_1c4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
          if (!bVar1) {
            testing::Message::Message(&local_1d0);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__5.message_,(internal *)local_1c0,
                       (AssertionResult *)"EVP_DigestSignFinal(md_ctx.get(), sig.data(), &sig_len)",
                       "false","true",in_R9);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_1d8,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                       ,0x18a,pcVar3);
            testing::internal::AssertHelper::operator=(&local_1d8,&local_1d0);
            testing::internal::AssertHelper::~AssertHelper(&local_1d8);
            std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_1d0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
          if (bVar1) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       &gtest_ar__4.message_,
                       (size_type)
                       gtest_ar__3.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
            bssl::internal::
            StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
            ::Reset((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                     *)&gtest_ar__1.message_);
            pEVar4 = (EVP_MD_CTX *)
                     bssl::internal::
                     StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                     ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                            *)&gtest_ar__1.message_);
            pEVar5 = EVP_sha256();
            pEVar6 = (EVP_PKEY *)
                     std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)
                                &gtest_ar_.message_);
            local_20c = EVP_DigestVerifyInit
                                  (pEVar4,(EVP_PKEY_CTX **)0x0,pEVar5,(ENGINE *)0x0,pEVar6);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_208,&local_20c,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
            if (!bVar1) {
              testing::Message::Message(&local_218);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar__6.message_,(internal *)local_208,
                         (AssertionResult *)
                         "EVP_DigestVerifyInit(md_ctx.get(), __null, EVP_sha256(), __null, pkey.get())"
                         ,"false","true",in_R9);
              pcVar3 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_220,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                         ,400,pcVar3);
              testing::internal::AssertHelper::operator=(&local_220,&local_218);
              testing::internal::AssertHelper::~AssertHelper(&local_220);
              std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
              testing::Message::~Message(&local_218);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
            if (bVar1) {
              peVar7 = bssl::internal::
                       StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                       ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                              *)&gtest_ar__1.message_);
              local_254 = EVP_DigestVerifyUpdate(peVar7,"\x01\x02\x03\x04",4);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_250,&local_254,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
              if (!bVar1) {
                testing::Message::Message(&local_260);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_250,
                           (AssertionResult *)
                           "EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg))","false","true"
                           ,in_R9);
                pcVar3 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_268,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                           ,0x191,pcVar3);
                testing::internal::AssertHelper::operator=(&local_268,&local_260);
                testing::internal::AssertHelper::~AssertHelper(&local_268);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_260);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
              if (bVar1) {
                pEVar4 = (EVP_MD_CTX *)
                         bssl::internal::
                         StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                         ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                                *)&gtest_ar__1.message_);
                puVar8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                    &gtest_ar__4.message_);
                local_29c = EVP_DigestVerifyFinal
                                      (pEVar4,puVar8,
                                       (size_t)gtest_ar__3.message_._M_t.
                                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               .
                                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                               ._M_head_impl);
                testing::AssertionResult::AssertionResult<int>
                          ((AssertionResult *)local_298,&local_29c,(type *)0x0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_298);
                if (!bVar1) {
                  testing::Message::Message(&local_2a8);
                  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                            (&local_2d0,(internal *)local_298,
                             (AssertionResult *)
                             "EVP_DigestVerifyFinal(md_ctx.get(), sig.data(), sig_len)","false",
                             "true",in_R9);
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  testing::internal::AssertHelper::AssertHelper
                            (&local_2b0,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                             ,0x192,pcVar3);
                  testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
                  testing::internal::AssertHelper::~AssertHelper(&local_2b0);
                  std::__cxx11::string::~string((string *)&local_2d0);
                  testing::Message::~Message(&local_2a8);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
              }
            }
          }
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar__4.message_)
          ;
        }
      }
    }
    bssl::internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)&gtest_ar__1.message_);
  }
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(EVPExtraTest, DigestSignInit) {
  bssl::UniquePtr<EVP_PKEY> pkey = LoadExampleRSAKey();
  ASSERT_TRUE(pkey);
  bssl::ScopedEVP_MD_CTX md_ctx;
  ASSERT_TRUE(
      EVP_DigestSignInit(md_ctx.get(), NULL, EVP_sha256(), NULL, pkey.get()));
  ASSERT_TRUE(EVP_DigestSignUpdate(md_ctx.get(), kMsg, sizeof(kMsg)));

  // Determine the size of the signature.
  size_t sig_len = 0;
  ASSERT_TRUE(EVP_DigestSignFinal(md_ctx.get(), NULL, &sig_len));

  // Sanity check for testing.
  EXPECT_EQ(static_cast<size_t>(EVP_PKEY_size(pkey.get())), sig_len);

  std::vector<uint8_t> sig;
  sig.resize(sig_len);
  ASSERT_TRUE(EVP_DigestSignFinal(md_ctx.get(), sig.data(), &sig_len));
  sig.resize(sig_len);

  // Ensure that the signature round-trips.
  md_ctx.Reset();
  ASSERT_TRUE(
      EVP_DigestVerifyInit(md_ctx.get(), NULL, EVP_sha256(), NULL, pkey.get()));
  ASSERT_TRUE(EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg)));
  ASSERT_TRUE(EVP_DigestVerifyFinal(md_ctx.get(), sig.data(), sig_len));
}